

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.cpp
# Opt level: O0

int main(void)

{
  byte bVar1;
  ulong uVar2;
  ostream *poVar3;
  double dVar4;
  SyntaxError *e;
  double x;
  undefined1 local_1a8 [8];
  string line;
  ExpressionTree et;
  
  expression_test();
  calculator::ExpressionTree::ExpressionTree((ExpressionTree *)((long)&line.field_2 + 8));
  std::__cxx11::string::string((string *)local_1a8);
  while (bVar1 = std::ios::good(), (bVar1 & 1) != 0) {
    std::operator<<((ostream *)&std::cout,">>> ");
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)&std::cin,(string *)local_1a8);
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      dVar4 = calculator::ExpressionTree::calcExpression
                        ((ExpressionTree *)((long)&line.field_2 + 8),(string *)local_1a8);
      std::ios_base::precision((ios_base *)((long)&std::cout + *(long *)(std::cout + -0x18)),10);
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,std::fixed);
      poVar3 = std::operator<<(poVar3,"=> ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,dVar4);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    }
  }
  std::__cxx11::string::~string((string *)local_1a8);
  calculator::ExpressionTree::~ExpressionTree((ExpressionTree *)((long)&line.field_2 + 8));
  return 0;
}

Assistant:

int main() {
    expression_test();
    ExpressionTree et;
    string line;
    while (cin.good()) {
        cout << ">>> ";
        getline(cin, line);
        if (line.empty()) continue;
        try {
            double x = et.calcExpression(line);
            cout.precision(10);
            cout << fixed << "=> " << x << endl;
        } catch (SyntaxError &e) {
            cout << e.what() << endl;
            cin.ignore();
            cin.clear();
        }
    }
    return 0;
}